

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O2

spv_result_t
spvtools::val::anon_unknown_0::ValidateImageDref
          (ValidationState_t *_,Instruction *inst,ImageTypeInfo *info)

{
  bool bVar1;
  uint32_t uVar2;
  string sStack_218;
  DiagnosticStream local_1f8;
  
  uVar2 = ValidationState_t::GetOperandTypeId(_,inst,4);
  bVar1 = ValidationState_t::IsFloatScalarType(_,uVar2);
  if ((bVar1) && (uVar2 = ValidationState_t::GetBitWidth(_,uVar2), uVar2 == 0x20)) {
    bVar1 = spvIsVulkanEnv(_->context_->target_env);
    if (!bVar1) {
      return SPV_SUCCESS;
    }
    if (info->dim != Dim3D) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_DATA,inst);
    ValidationState_t::VkErrorID_abi_cxx11_(&sStack_218,_,0x12a9,(char *)0x0);
    std::operator<<((ostream *)&local_1f8,(string *)&sStack_218);
    std::operator<<((ostream *)&local_1f8,
                    "In Vulkan, OpImage*Dref* instructions must not use images with a 3D Dim");
    std::__cxx11::string::_M_dispose();
  }
  else {
    ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_DATA,inst);
    std::operator<<((ostream *)&local_1f8,"Expected Dref to be of 32-bit float type");
  }
  DiagnosticStream::~DiagnosticStream(&local_1f8);
  return local_1f8.error_;
}

Assistant:

spv_result_t ValidateImageDref(ValidationState_t& _, const Instruction* inst,
                               const ImageTypeInfo& info) {
  const uint32_t dref_type = _.GetOperandTypeId(inst, 4);
  if (!_.IsFloatScalarType(dref_type) || _.GetBitWidth(dref_type) != 32) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Dref to be of 32-bit float type";
  }

  if (spvIsVulkanEnv(_.context()->target_env)) {
    if (info.dim == spv::Dim::Dim3D) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4777)
             << "In Vulkan, OpImage*Dref* instructions must not use images "
                "with a 3D Dim";
    }
  }

  return SPV_SUCCESS;
}